

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gregocal.cpp
# Opt level: O0

UBool __thiscall
icu_63::GregorianCalendar::inDaylightTime(GregorianCalendar *this,UErrorCode *status)

{
  UBool UVar1;
  int iVar2;
  int32_t iVar3;
  TimeZone *pTVar4;
  UErrorCode *status_local;
  GregorianCalendar *this_local;
  
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    pTVar4 = Calendar::getTimeZone(&this->super_Calendar);
    iVar2 = (*(pTVar4->super_UObject)._vptr_UObject[9])();
    if ((char)iVar2 != '\0') {
      Calendar::complete(&this->super_Calendar,status);
      UVar1 = ::U_SUCCESS(*status);
      if (UVar1 != '\0') {
        iVar3 = Calendar::internalGet(&this->super_Calendar,UCAL_DST_OFFSET);
        return iVar3 != 0;
      }
      return '\0';
    }
  }
  return '\0';
}

Assistant:

UBool
GregorianCalendar::inDaylightTime(UErrorCode& status) const
{
    if (U_FAILURE(status) || !getTimeZone().useDaylightTime()) 
        return FALSE;

    // Force an update of the state of the Calendar.
    ((GregorianCalendar*)this)->complete(status); // cast away const

    return (UBool)(U_SUCCESS(status) ? (internalGet(UCAL_DST_OFFSET) != 0) : FALSE);
}